

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>
::cni_holder(cni_holder<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>
             *this,_func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr
                   **func)

{
  function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)> *in_RDI;
  cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>
  *this_00;
  function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>
  *in_stack_ffffffffffffffc0;
  _func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003e3588;
  this_00 = (cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<void(std::shared_ptr<std::ostream>&)>::
  function<void(*const&)(std::shared_ptr<std::ostream>&),void>(in_stack_ffffffffffffffc0,local_30);
  cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>::
  ~function((function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>
             *)0x2c3ca6);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}